

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_finally.cpp
# Opt level: O3

void __thiscall tst_qpromise_finally::fulfilledThrows_void(tst_qpromise_finally *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar3;
  PromiseDataBase<void,_void_()> *pPVar4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar5;
  Data *pDVar6;
  PromiseResolver<void> PVar7;
  bool bVar8;
  char cVar9;
  PromiseDataBase<void,_void_()> *this_00;
  PromiseData<void> *pPVar10;
  char *pcVar11;
  char *pcVar12;
  QPromiseReject<void> *in_R8;
  QByteArrayView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_158;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QStack_150;
  Data *local_148;
  PromiseDataBase<void,_void_()> *local_140;
  PromiseDataBase<void,_void_()> *local_130;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_128;
  QPromise<void> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_110;
  PromiseResolver<void> resolver_1;
  QString local_100;
  function<void_()> local_e8;
  QSharedData *local_c0;
  QString local_b8;
  Data *local_a0;
  PromiseResolver<void> resolver;
  _Manager_type local_88;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _func_int **local_38;
  
  QtPromise::QPromise<void>::resolve();
  if ((PromiseDataBase<void,_void_()> *)local_b8.d.ptr != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    (((QSharedData *)((long)local_b8.d.ptr + 8))->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)((long)local_b8.d.ptr + 8))->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_130 = (PromiseDataBase<void,_void_()> *)local_b8.d.ptr;
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012cb68;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012caf0;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_c0 = &this_00->super_QSharedData;
  local_e8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0012ca88;
  local_e8.super__Function_base._M_functor._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_e8);
  local_e8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0012cad0;
  if ((PromiseDataBase<void,_void_()> *)local_e8.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_e8.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_e8.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (**(code **)(*(long *)local_e8.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar7.m_d.d = resolver.m_d.d;
  local_a0 = (Data *)&PTR__QPromiseBase_0012ca88;
  local_38 = (_func_int **)&PTR__PromiseDataBase_0012cb68;
  if (resolver.m_d.d == (Data *)0x0) {
    local_158.d = (Data *)0x0;
LAB_001075eb:
    QStack_150.d = (Data *)0x0;
    bVar8 = true;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    if (resolver.m_d.d == (Data *)0x0) {
      local_158 = resolver.m_d.d;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      goto LAB_001075eb;
    }
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_158 = resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    QStack_150 = resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    bVar8 = false;
  }
  QVar3.d = QStack_150.d;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(Data **)local_58._M_unused._0_8_ = local_158.d;
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_58._M_unused._0_8_ + 8) = QStack_150.d;
  if (QStack_150.d == (Data *)0x0) {
    pcStack_40 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pcStack_40 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
    if (QStack_150.d != (Data *)0x0) {
      LOCK();
      ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QStack_150.d,0x10);
      }
    }
  }
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_158.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (local_130,(function<void_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_158 = PVar7.m_d.d;
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + 1;
    UNLOCK();
  }
  if (!bVar8) {
    LOCK();
    ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  QStack_150.d = QVar3.d;
  local_78._M_unused._M_object = operator_new(0x18);
  *(Data **)local_78._M_unused._0_8_ = local_158.d;
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_78._M_unused._0_8_ + 8) = QStack_150.d;
  if (QStack_150.d == (Data *)0x0) {
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
    if (QStack_150.d != (Data *)0x0) {
      LOCK();
      ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QStack_150.d,0x10);
      }
    }
  }
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_158.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (local_130,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (!bVar8) {
    LOCK();
    ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar3.d,0x10);
    }
  }
  pDVar6 = local_a0;
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(local_130);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(local_130);
  }
  pQVar1 = &local_130->super_QSharedData;
  LOCK();
  (local_130->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i =
       (local_130->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012cad0;
  pPVar10 = (PromiseData<void> *)operator_new(0x58);
  (pPVar10->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar10->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = local_38;
  QReadWriteLock::QReadWriteLock(&(pPVar10->super_PromiseDataBase<void,_void_()>).m_lock,0);
  pPVar4 = local_130;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_settled = false;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar10->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar10->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0012caf0;
  LOCK();
  pQVar2 = &(pPVar10->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar10 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar10->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_100.d.d = pDVar6;
  p.super_QPromiseBase<void>.m_d.d = pPVar10;
  local_100.d.ptr = (char16_t *)pPVar10;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&local_100)
  ;
  local_100.d.d = (Data *)&PTR__QPromiseBase_0012cad0;
  if ((PromiseData<void> *)local_100.d.ptr != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar2 = &((PromiseDataBase<void,_void_()> *)local_100.d.ptr)->super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<void> *)local_100.d.ptr != (PromiseData<void> *)0x0)) {
      (*((PromiseDataBase<void,_void_()> *)local_100.d.ptr)->_vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_110.d = (Data *)0x0;
    local_128.d = (Data *)0x0;
    goto LAB_001079bc;
  }
  LOCK();
  *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
  UNLOCK();
  local_110 = resolver_1.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_128.d = (Data *)0x0;
LAB_001079a7:
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    if (local_128.d == (Data *)0x0) goto LAB_001079bc;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_128 = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) goto LAB_001079a7;
  }
  LOCK();
  ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i =
       ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
LAB_001079bc:
  local_140 = pPVar4;
  LOCK();
  (pPVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_148 = pDVar6;
  local_e8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_e8.super__Function_base._M_functor._8_8_ = 0;
  local_e8.super__Function_base._M_manager = (_Manager_type)0x0;
  local_e8._M_invoker = (_Invoker_type)0x0;
  local_158.d = local_110.d;
  QStack_150.d = local_128.d;
  local_e8.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(Data **)local_e8.super__Function_base._M_functor._M_unused._0_8_ = local_158.d;
  if ((QArrayData *)local_158.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_158.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_158.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 8) = QStack_150.d;
  if (QStack_150.d != (Data *)0x0) {
    LOCK();
    ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_0012cad0;
  *(PromiseDataBase<void,_void_()> **)
   ((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = local_140;
  if (local_140 == (PromiseDataBase<void,_void_()> *)0x0) {
    *(Data **)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = pDVar6;
    local_e8._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_invoke;
    local_e8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_manager;
    local_148 = (Data *)&PTR__QPromiseBase_0012cad0;
  }
  else {
    LOCK();
    (local_140->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_140->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(Data **)((long)local_e8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = pDVar6;
    local_e8._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_invoke;
    local_e8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_manager;
    local_148 = (Data *)&PTR__QPromiseBase_0012cad0;
    if (local_140 != (PromiseDataBase<void,_void_()> *)0x0) {
      LOCK();
      pQVar2 = &local_140->super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (local_140 != (PromiseDataBase<void,_void_()> *)0x0)) {
        (*local_140->_vptr_PromiseDataBase[1])();
      }
    }
  }
  if (QStack_150.d != (Data *)0x0) {
    LOCK();
    ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         ((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_150.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QStack_150.d,0x10);
    }
  }
  if ((QArrayData *)local_158.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_158.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_158.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_158.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i == 0) {
      operator_delete(local_158.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler(this_00,&local_e8);
  if (local_e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e8.super__Function_base._M_manager)
              ((_Any_data *)&local_e8,(_Any_data *)&local_e8,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_110,
             (QPromiseResolve<void> *)&local_128,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (this_00,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  }
  if (local_128.d != (Data *)0x0) {
    LOCK();
    ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_128.d,0x10);
    }
  }
  if ((QArrayData *)local_110.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_110.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_110.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_110.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i == 0) {
      operator_delete(local_110.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)pDVar6;
  bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_00);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar4->_vptr_PromiseDataBase[1])(pPVar4);
  }
  LOCK();
  (local_c0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_c0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_c0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar4->_vptr_PromiseDataBase[1])(pPVar4);
  }
  local_b8.d.d = (Data *)&PTR__QPromiseBase_0012cad0;
  if ((PromiseDataBase<void,_void_()> *)local_b8.d.ptr != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)((long)local_b8.d.ptr + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_b8.d.ptr != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (*(*(_func_int ***)local_b8.d.ptr)[1])();
    }
  }
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char16_t *)0x0;
  local_b8.d.size = 0;
  waitForError<QString>(&local_100,&p,&local_b8);
  QVar13.m_data = (storage_type *)((long)&iRam0000000000000000 + 3);
  QVar13.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar13);
  QVar3.d = local_158.d;
  QVar14.m_data = local_100.d.ptr;
  QVar14.m_size = local_100.d.size;
  QVar15.m_data = (storage_type_conflict *)QStack_150.d;
  QVar15.m_size = (qsizetype)local_148;
  cVar9 = QTest::qCompare(QVar14,QVar15,"waitForError(p, QString{})","QString{\"bar\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                          ,0x51);
  if ((QArrayData *)QVar3.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(QVar3.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(QVar3.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(QVar3.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate((QArrayData *)QVar3.d,2,8);
    }
  }
  if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
    }
  }
  QVar5.d = p.super_QPromiseBase<void>.m_d.d;
  if (cVar9 == '\0') {
    if (p.super_QPromiseBase<void>.m_d.d == (PromiseData<void> *)0x0) {
      return;
    }
  }
  else {
    bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                      (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
    bVar8 = (bool)(~bVar8 & ((QVar5.d)->super_PromiseDataBase<void,_void_()>).m_error.m_data.
                            _M_exception_object != (void *)0x0);
    local_158.d._0_1_ = bVar8;
    local_100.d.d = (Data *)CONCAT71(local_100.d.d._1_7_,1);
    pcVar11 = QTest::toString<bool>((bool *)&local_158);
    pcVar12 = QTest::toString<bool>((bool *)&local_100);
    QTest::compare_helper
              (bVar8,"Compared values are not the same",pcVar11,pcVar12,"p.isRejected()","true",
               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
               ,0x52);
  }
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012cad0;
  LOCK();
  pQVar1 = &((QVar5.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     (p.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
    (*((p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
      _vptr_PromiseDataBase[1])();
  }
  return;
}

Assistant:

void tst_qpromise_finally::fulfilledThrows_void()
{
    auto p = QtPromise::QPromise<void>::resolve().finally([&]() {
        throw QString{"bar"};
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(waitForError(p, QString{}), QString{"bar"});
    QCOMPARE(p.isRejected(), true);
}